

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

mt32emu_return_code MT32Emu::createFileStream(char *filename,FileStream **fileStream)

{
  uint uVar1;
  int iVar2;
  FileStream *this;
  undefined4 extraout_var;
  int __oflag;
  mt32emu_return_code local_24;
  mt32emu_return_code rc;
  FileStream **fileStream_local;
  char *filename_local;
  
  this = (FileStream *)operator_new(0x58);
  FileStream::FileStream(this);
  *fileStream = this;
  uVar1 = FileStream::open(*fileStream,filename,__oflag);
  if ((uVar1 & 1) == 0) {
    local_24 = MT32EMU_RC_FILE_NOT_FOUND;
  }
  else {
    iVar2 = (*((*fileStream)->super_AbstractFile).super_File._vptr_File[2])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      return MT32EMU_RC_OK;
    }
    local_24 = MT32EMU_RC_FILE_NOT_LOADED;
  }
  if (*fileStream != (FileStream *)0x0) {
    (*((*fileStream)->super_AbstractFile).super_File._vptr_File[1])();
  }
  *fileStream = (FileStream *)0x0;
  return local_24;
}

Assistant:

static mt32emu_return_code createFileStream(const char *filename, FileStream *&fileStream) {
	mt32emu_return_code rc;
	fileStream = new FileStream;
	if (!fileStream->open(filename)) {
		rc = MT32EMU_RC_FILE_NOT_FOUND;
	} else if (fileStream->getSize() == 0) {
		rc = MT32EMU_RC_FILE_NOT_LOADED;
	} else {
		return MT32EMU_RC_OK;
	}
	delete fileStream;
	fileStream = NULL;
	return rc;
}